

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VisionFeaturePrint.pb.cc
# Opt level: O2

uint8_t * __thiscall
CoreML::Specification::CoreMLModels::VisionFeaturePrint_Scene::_InternalSerialize
          (VisionFeaturePrint_Scene *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  uint8_t *puVar1;
  ulong uVar2;
  
  if (this->version_ != 0) {
    puVar1 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = google::protobuf::internal::WireFormatLite::WriteEnumToArray(1,this->version_,puVar1);
  }
  uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar2 & 1) == 0) {
    return target;
  }
  uVar2 = uVar2 & 0xfffffffffffffffc;
  puVar1 = google::protobuf::io::EpsCopyOutputStream::WriteRaw
                     (stream,*(void **)(uVar2 + 8),*(int *)(uVar2 + 0x10),target);
  return puVar1;
}

Assistant:

uint8_t* VisionFeaturePrint_Scene::_InternalSerialize(
    uint8_t* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:CoreML.Specification.CoreMLModels.VisionFeaturePrint.Scene)
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  // .CoreML.Specification.CoreMLModels.VisionFeaturePrint.Scene.SceneVersion version = 1;
  if (this->_internal_version() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteEnumToArray(
      1, this->_internal_version(), target);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).data(),
        static_cast<int>(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:CoreML.Specification.CoreMLModels.VisionFeaturePrint.Scene)
  return target;
}